

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O2

int __thiscall IndexTree::rotateOnce(IndexTree *this,int32_t *root,int direction)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  Node *pNVar4;
  short sVar5;
  short sVar6;
  bool bVar7;
  
  iVar1 = *root;
  pNVar4 = this->nodes;
  bVar7 = direction == -1;
  iVar2 = (&pNVar4[iVar1].left)[bVar7];
  uVar3 = *(undefined4 *)&pNVar4[iVar2].balance_factor;
  *root = iVar2;
  (&pNVar4[iVar1].left)[bVar7] = (&pNVar4[iVar2].left)[!bVar7];
  (&pNVar4[iVar2].left)[!bVar7] = iVar1;
  sVar5 = (short)uVar3;
  sVar6 = (-(ushort)bVar7 | 1) + sVar5;
  pNVar4[iVar2].balance_factor = sVar6;
  pNVar4[iVar1].balance_factor = -sVar6;
  return (uint)(sVar5 != 0);
}

Assistant:

int IndexTree::rotateOnce(int32_t &root, int direction) {
//    printf("Rotate once\n");
    auto old_root = root;
    auto &_old_root = nodes[root];
    auto &old_root_other_dir = direction == -1 ? _old_root.right : _old_root.left;
    auto &_other_dir = nodes[old_root_other_dir];

    int height_change = _other_dir.balance_factor == 0 ? 0 : 1;

    // do the rotation
    root = old_root_other_dir;
    auto &_new_root = nodes[root];
    auto &new_root_this_dir = direction == -1 ? _new_root.left : _new_root.right;
    old_root_other_dir = new_root_this_dir;
    new_root_this_dir = old_root;

    _old_root.balance_factor = -(direction == -1 ? --_new_root.balance_factor : ++_new_root.balance_factor);

    return height_change;
}